

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O2

int flush_header(FILE *output_file_ptr)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  char *__s;
  undefined1 local_19;
  
  uVar3 = (uint)first_byte_written;
  iVar1 = get_available_bits((long)out_bit_idx);
  uVar3 = (uint)(byte)((char)iVar1 << 5) | uVar3 & 0x1f;
  local_19 = (undefined1)uVar3;
  fputc(uVar3,(FILE *)output_file_ptr);
  iVar1 = fseek((FILE *)output_file_ptr,0,0);
  if (iVar1 == 0) {
    sVar2 = fwrite(&local_19,1,1,(FILE *)output_file_ptr);
    if (sVar2 != 0) {
      return 0;
    }
    __s = "failed to overwrite first byte";
  }
  else {
    __s = "error moving file ptr to beginning";
  }
  perror(__s);
  return 1;
}

Assistant:

int flush_header(FILE* output_file_ptr) {
#ifdef _DEBUG
    log_trace("flush_header", "old_bits=");
    log_trace_char_bin(first_byte_written);
#endif

    first_byte_union first_byte;
    first_byte.raw = first_byte_written;
    first_byte.split.header = (byte_t)get_available_bits(out_bit_idx);

#ifdef _DEBUG
    log_trace("flush_header", "new_bits=");
    log_trace_char_bin(first_byte.raw);
#endif

    fputc(first_byte.raw, output_file_ptr);

    if ( fseek(output_file_ptr, 0L, SEEK_SET) != 0 ) {
        perror("error moving file ptr to beginning");
        return RC_FAIL;
    }

    size_t bytesWritten = fwrite(&first_byte.raw, sizeof(byte_t), 1, output_file_ptr);
    if(bytesWritten == 0) {
        perror("failed to overwrite first byte");
        return RC_FAIL;
    }

    return RC_OK;
}